

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O2

bool __thiscall
ot::commissioner::security_material::SecurityMaterials::IsIncomplete
          (SecurityMaterials *this,bool aNeedCert,bool aNeedPSKc,bool aNeedToken)

{
  undefined7 in_register_00000031;
  bool bVar1;
  
  if (((int)CONCAT71(in_register_00000031,aNeedCert) != 0) &&
     ((((this->mCertificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->mCertificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ||
       ((this->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start)) ||
      ((this->mTrustAnchor).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish ==
       (this->mTrustAnchor).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start)))) {
    return true;
  }
  if (aNeedToken) {
    bVar1 = (this->mCommissionerToken).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->mCommissionerToken).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (!aNeedPSKc || bVar1) {
      return bVar1;
    }
  }
  else if (!aNeedPSKc) {
    return false;
  }
  return (this->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (this->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

bool SecurityMaterials::IsIncomplete(bool aNeedCert, bool aNeedPSKc, bool aNeedToken /*=false*/) const
{
    return (aNeedCert && (mCertificate.size() == 0 || mPrivateKey.size() == 0 || mTrustAnchor.size() == 0)) ||
           (aNeedToken && mCommissionerToken.size() == 0) || (aNeedPSKc && mPSKc.size() == 0);
}